

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_error
adios2_inquire_all_attributes(adios2_attribute ***attributes,size_t *size,adios2_io *io)

{
  _Rb_tree_node_base *__k;
  size_t __nmemb;
  AttrMap *pAVar1;
  const_iterator cVar2;
  Attribute *pAVar3;
  _Base_ptr p_Var4;
  AttrMap *pAVar5;
  string *this;
  allocator local_2b9;
  adios2_io *local_2b8;
  allocator local_2a9;
  string local_2a8 [32];
  adios2_attribute **local_288;
  adios2_attribute **local_280;
  adios2_attribute ***local_278;
  AttrMap *__range2;
  _Rb_tree_node_base *local_268;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string local_230;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string
            ((string *)&local_230,"for adios2_io, in call to adios2_inquire_all_attributes",
             (allocator *)&names);
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  pAVar1 = (AttrMap *)adios2::core::IO::GetAttributes_abi_cxx11_();
  __nmemb = *(size_t *)(pAVar1 + 0x18);
  *size = __nmemb;
  local_288 = (adios2_attribute **)calloc(__nmemb,8);
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &names._M_t._M_impl.super__Rb_tree_header._M_header;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pAVar5 = pAVar1 + 0x10;
  __range2 = pAVar1;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pAVar5 = *(AttrMap **)pAVar5, pAVar5 != (AttrMap *)0x0) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&names,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pAVar5 + 8));
  }
  local_280 = local_288;
  p_Var4 = names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b8 = io;
  local_278 = attributes;
  do {
    if ((_Rb_tree_header *)p_Var4 == &names._M_t._M_impl.super__Rb_tree_header) {
      *local_278 = local_288;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&names._M_t);
      return adios2_error_none;
    }
    __k = p_Var4 + 1;
    local_268 = p_Var4;
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)__range2,(key_type *)__k);
    switch(*(undefined4 *)
            (*(long *)((long)cVar2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                             ._M_cur + 0x28) + 0x28)) {
    case 1:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_90,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<signed_char>(local_2b8,__k,local_2a8,local_90);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_2a8);
      goto LAB_0011d0dc;
    case 2:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_b0,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<short>(local_2b8,__k,local_2a8,local_b0);
      this = local_b0;
      break;
    case 3:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_d0,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<int>(local_2b8,__k,local_2a8,local_d0);
      this = local_d0;
      break;
    case 4:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_f0,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<long>(local_2b8,__k,local_2a8,local_f0);
      this = local_f0;
      break;
    case 5:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_110,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<unsigned_char>(local_2b8,__k,local_2a8,local_110);
      this = local_110;
      break;
    case 6:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_130,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<unsigned_short>(local_2b8,__k,local_2a8,local_130)
      ;
      this = local_130;
      break;
    case 7:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_150,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<unsigned_int>(local_2b8,__k,local_2a8,local_150);
      this = local_150;
      break;
    case 8:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_170,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<unsigned_long>(local_2b8,__k,local_2a8,local_170);
      this = local_170;
      break;
    case 9:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_190,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<float>(local_2b8,__k,local_2a8,local_190);
      this = local_190;
      break;
    case 10:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_1b0,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<double>(local_2b8,__k,local_2a8,local_1b0);
      this = local_1b0;
      break;
    case 0xb:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_1d0,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<long_double>(local_2b8,__k,local_2a8,local_1d0);
      this = local_1d0;
      break;
    case 0xc:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_1f0,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<std::complex<float>>
                         (local_2b8,__k,local_2a8,local_1f0);
      this = local_1f0;
      break;
    case 0xd:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_210,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<std::complex<double>>
                         (local_2b8,__k,local_2a8,local_210);
      this = local_210;
      break;
    case 0xe:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_50,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<std::__cxx11::string>
                         (local_2b8,__k,local_2a8,local_50);
      this = local_50;
      break;
    case 0xf:
      std::__cxx11::string::string(local_2a8,"",&local_2b9);
      std::__cxx11::string::string(local_70,"/",&local_2a9);
      pAVar3 = adios2::core::IO::InquireAttribute<char>(local_2b8,__k,local_2a8,local_70);
      this = local_70;
      break;
    default:
      goto switchD_0011cca6_default;
    }
    std::__cxx11::string::~string(this);
    std::__cxx11::string::~string(local_2a8);
LAB_0011d0dc:
    *local_280 = (adios2_attribute *)pAVar3;
switchD_0011cca6_default:
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(local_268);
    local_280 = local_280 + 1;
  } while( true );
}

Assistant:

adios2_error adios2_inquire_all_attributes(adios2_attribute ***attributes, size_t *size,
                                           adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_inquire_all_attributes");

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        const auto &dataMap = ioCpp.GetAttributes();

        *size = dataMap.size();
        adios2_attribute **list = (adios2_attribute **)calloc(*size, sizeof(adios2_attribute *));

        // Sort the names so that we return the same order as the
        // C++, python APIs
        std::set<std::string> names;
        for (auto &it : dataMap)
            names.insert(it.first);

        size_t n = 0;
        for (auto &name : names)
        {
            auto it = dataMap.find(name);
            const adios2::DataType type(it->second->m_Type);
            adios2::core::AttributeBase *attribute = nullptr;

            if (type == adios2::DataType::Struct)
            {
                // not supported
            }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        attribute = ioCpp.InquireAttribute<T>(name);                                               \
        list[n] = reinterpret_cast<adios2_attribute *>(attribute);                                 \
    }
            ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

            n++;
        }
        *attributes = list;
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_inquire_all_attributes"));
    }
}